

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context local_100;
  
  __off = ftell((FILE *)f);
  local_100.img_buffer = local_100.buffer_start;
  local_100.io.eof = stbi__stdio_eof;
  local_100.io.read = stbi__stdio_read;
  local_100.io.skip = stbi__stdio_skip;
  local_100.read_from_callbacks = 1;
  local_100.buflen = 0x80;
  local_100.callback_already_read = 0;
  local_100.io_user_data = f;
  local_100.img_buffer_original = local_100.img_buffer;
  stbi__refill_buffer(&local_100);
  local_100.img_buffer_original_end = local_100.img_buffer_end;
  iVar1 = stbi__hdr_test(&local_100);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   long pos = ftell(f);
   int res;
   stbi__context s;
   stbi__start_file(&s,f);
   res = stbi__hdr_test(&s);
   fseek(f, pos, SEEK_SET);
   return res;
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}